

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::Parser::GenerateMapEntry
          (Parser *this,MapField *map_field,FieldDescriptorProto *field,
          RepeatedPtrField<google::protobuf::DescriptorProto> *messages)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  bool bVar5;
  DescriptorProto *this_00;
  MessageOptions *pMVar6;
  FieldDescriptorProto *this_01;
  FieldDescriptorProto *this_02;
  Type *from;
  Type *pTVar7;
  FieldOptions *pFVar8;
  UninterpretedOption *pUVar9;
  undefined8 *puVar10;
  int i;
  int index;
  undefined1 *puVar11;
  long *plVar12;
  long lVar13;
  string entry_name;
  
  this_00 = RepeatedPtrField<google::protobuf::DescriptorProto>::Add(messages);
  entry_name._M_dataplus._M_p = (pointer)&entry_name.field_2;
  entry_name._M_string_length = 0;
  plVar12 = (long *)((ulong)(field->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
  entry_name.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)&entry_name);
  lVar2 = *plVar12;
  lVar3 = plVar12[1];
  for (lVar13 = 0; lVar3 != lVar13; lVar13 = lVar13 + 1) {
    if (*(char *)(lVar2 + lVar13) != '_') {
      std::__cxx11::string::push_back((char)&entry_name);
    }
  }
  std::__cxx11::string::append((char *)&entry_name);
  *(byte *)(field->_has_bits_).has_bits_ = (byte)(field->_has_bits_).has_bits_[0] | 4;
  uVar4 = (field->super_Message).super_MessageLite._internal_metadata_.ptr_;
  puVar10 = (undefined8 *)(uVar4 & 0xfffffffffffffffc);
  if ((uVar4 & 1) != 0) {
    puVar10 = (undefined8 *)*puVar10;
  }
  internal::ArenaStringPtr::Set(&field->type_name_,&entry_name,puVar10);
  *(byte *)(this_00->_has_bits_).has_bits_ = (byte)(this_00->_has_bits_).has_bits_[0] | 1;
  uVar4 = (this_00->super_Message).super_MessageLite._internal_metadata_.ptr_;
  puVar10 = (undefined8 *)(uVar4 & 0xfffffffffffffffc);
  if ((uVar4 & 1) != 0) {
    puVar10 = (undefined8 *)*puVar10;
  }
  internal::ArenaStringPtr::Set(&this_00->name_,&entry_name,puVar10);
  pMVar6 = DescriptorProto::_internal_mutable_options(this_00);
  *(byte *)(pMVar6->_has_bits_).has_bits_ = (byte)(pMVar6->_has_bits_).has_bits_[0] | 8;
  pMVar6->map_entry_ = true;
  this_01 = RepeatedPtrField<google::protobuf::FieldDescriptorProto>::Add(&this_00->field_);
  *(byte *)(this_01->_has_bits_).has_bits_ = (byte)(this_01->_has_bits_).has_bits_[0] | 1;
  uVar4 = (this_01->super_Message).super_MessageLite._internal_metadata_.ptr_;
  puVar10 = (undefined8 *)(uVar4 & 0xfffffffffffffffc);
  if ((uVar4 & 1) != 0) {
    puVar10 = (undefined8 *)*puVar10;
  }
  internal::ArenaStringPtr::Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            (&this_01->name_,"key",puVar10);
  FieldDescriptorProto::_internal_set_label(this_01,FieldDescriptorProto_Label_LABEL_OPTIONAL);
  uVar1 = (this_01->_has_bits_).has_bits_[0];
  (this_01->_has_bits_).has_bits_[0] = uVar1 | 0x40;
  this_01->number_ = 1;
  if ((map_field->key_type_name)._M_string_length == 0) {
    FieldDescriptorProto::_internal_set_type(this_01,map_field->key_type);
  }
  else {
    (this_01->_has_bits_).has_bits_[0] = uVar1 | 0x44;
    uVar4 = (this_01->super_Message).super_MessageLite._internal_metadata_.ptr_;
    puVar10 = (undefined8 *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      puVar10 = (undefined8 *)*puVar10;
    }
    internal::ArenaStringPtr::Set(&this_01->type_name_,&map_field->key_type_name,puVar10);
  }
  this_02 = RepeatedPtrField<google::protobuf::FieldDescriptorProto>::Add(&this_00->field_);
  *(byte *)(this_02->_has_bits_).has_bits_ = (byte)(this_02->_has_bits_).has_bits_[0] | 1;
  uVar4 = (this_02->super_Message).super_MessageLite._internal_metadata_.ptr_;
  puVar10 = (undefined8 *)(uVar4 & 0xfffffffffffffffc);
  if ((uVar4 & 1) != 0) {
    puVar10 = (undefined8 *)*puVar10;
  }
  internal::ArenaStringPtr::Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            (&this_02->name_,"value",puVar10);
  FieldDescriptorProto::_internal_set_label(this_02,FieldDescriptorProto_Label_LABEL_OPTIONAL);
  uVar1 = (this_02->_has_bits_).has_bits_[0];
  (this_02->_has_bits_).has_bits_[0] = uVar1 | 0x40;
  this_02->number_ = 2;
  if ((map_field->value_type_name)._M_string_length == 0) {
    FieldDescriptorProto::_internal_set_type(this_02,map_field->value_type);
  }
  else {
    (this_02->_has_bits_).has_bits_[0] = uVar1 | 0x44;
    uVar4 = (this_02->super_Message).super_MessageLite._internal_metadata_.ptr_;
    puVar10 = (undefined8 *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      puVar10 = (undefined8 *)*puVar10;
    }
    internal::ArenaStringPtr::Set(&this_02->type_name_,&map_field->value_type_name,puVar10);
  }
  index = 0;
  while( true ) {
    puVar11 = (undefined1 *)field->options_;
    if ((FieldOptions *)puVar11 == (FieldOptions *)0x0) {
      puVar11 = _FieldOptions_default_instance_;
    }
    if ((((FieldOptions *)puVar11)->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_
        <= index) break;
    from = internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption>::TypeHandler>
                     (&(((FieldOptions *)puVar11)->uninterpreted_option_).super_RepeatedPtrFieldBase
                      ,index);
    if ((from->name_).super_RepeatedPtrFieldBase.current_size_ == 1) {
      pTVar7 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart>::TypeHandler>
                         (&(from->name_).super_RepeatedPtrFieldBase,0);
      bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((ulong)(pTVar7->name_part_).tagged_ptr_.ptr_ & 0xfffffffffffffffe),
                              "enforce_utf8");
      if ((bVar5) &&
         (pTVar7 = internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart>::TypeHandler>
                             (&(from->name_).super_RepeatedPtrFieldBase,0),
         pTVar7->is_extension_ == false)) {
        if (this_01->type_ == 9) {
          pFVar8 = FieldDescriptorProto::_internal_mutable_options(this_01);
          pUVar9 = RepeatedPtrField<google::protobuf::UninterpretedOption>::Add
                             (&pFVar8->uninterpreted_option_);
          UninterpretedOption::CopyFrom(pUVar9,from);
        }
        if (this_02->type_ == 9) {
          pFVar8 = FieldDescriptorProto::_internal_mutable_options(this_02);
          pUVar9 = RepeatedPtrField<google::protobuf::UninterpretedOption>::Add
                             (&pFVar8->uninterpreted_option_);
          UninterpretedOption::CopyFrom(pUVar9,from);
        }
      }
    }
    index = index + 1;
  }
  std::__cxx11::string::~string((string *)&entry_name);
  return;
}

Assistant:

void Parser::GenerateMapEntry(const MapField& map_field,
                              FieldDescriptorProto* field,
                              RepeatedPtrField<DescriptorProto>* messages) {
  DescriptorProto* entry = messages->Add();
  std::string entry_name = MapEntryName(field->name());
  field->set_type_name(entry_name);
  entry->set_name(entry_name);
  entry->mutable_options()->set_map_entry(true);
  FieldDescriptorProto* key_field = entry->add_field();
  key_field->set_name("key");
  key_field->set_label(FieldDescriptorProto::LABEL_OPTIONAL);
  key_field->set_number(1);
  if (map_field.key_type_name.empty()) {
    key_field->set_type(map_field.key_type);
  } else {
    key_field->set_type_name(map_field.key_type_name);
  }
  FieldDescriptorProto* value_field = entry->add_field();
  value_field->set_name("value");
  value_field->set_label(FieldDescriptorProto::LABEL_OPTIONAL);
  value_field->set_number(2);
  if (map_field.value_type_name.empty()) {
    value_field->set_type(map_field.value_type);
  } else {
    value_field->set_type_name(map_field.value_type_name);
  }
  // Propagate the "enforce_utf8" option to key and value fields if they
  // are strings. This helps simplify the implementation of code generators
  // and also reflection-based parsing code.
  //
  // The following definition:
  //   message Foo {
  //     map<string, string> value = 1 [enforce_utf8 = false];
  //   }
  // will be interpreted as:
  //   message Foo {
  //     message ValueEntry {
  //       option map_entry = true;
  //       string key = 1 [enforce_utf8 = false];
  //       string value = 2 [enforce_utf8 = false];
  //     }
  //     repeated ValueEntry value = 1 [enforce_utf8 = false];
  //  }
  //
  // TODO(xiaofeng): Remove this when the "enforce_utf8" option is removed
  // from protocol compiler.
  for (int i = 0; i < field->options().uninterpreted_option_size(); ++i) {
    const UninterpretedOption& option =
        field->options().uninterpreted_option(i);
    if (option.name_size() == 1 &&
        option.name(0).name_part() == "enforce_utf8" &&
        !option.name(0).is_extension()) {
      if (key_field->type() == FieldDescriptorProto::TYPE_STRING) {
        key_field->mutable_options()->add_uninterpreted_option()->CopyFrom(
            option);
      }
      if (value_field->type() == FieldDescriptorProto::TYPE_STRING) {
        value_field->mutable_options()->add_uninterpreted_option()->CopyFrom(
            option);
      }
    }
  }
}